

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# meshes.cpp
# Opt level: O3

Mesh * vera::floorMesh(Mesh *__return_storage_ptr__,float _area,int _subD,float _y)

{
  uint32_t _i;
  double dVar1;
  uint32_t uVar2;
  int x;
  int iVar3;
  int iVar4;
  int iVar5;
  uint32_t _i_00;
  uint32_t _i_01;
  bool bVar6;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dd;
  float fVar7;
  vec4 local_78;
  int local_68;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_64;
  anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5 local_60;
  anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7 local_5c;
  undefined1 local_58 [16];
  undefined8 local_48;
  undefined8 uStack_40;
  
  local_64.y = _y;
  dVar1 = ldexp(1.0,_subD);
  local_58._8_4_ = extraout_XMM0_Dc;
  local_58._0_8_ = dVar1;
  local_58._12_4_ = extraout_XMM0_Dd;
  iVar4 = (int)dVar1;
  Mesh::Mesh(__return_storage_ptr__);
  if (-1 < iVar4) {
    local_48 = CONCAT44((float)(int)(double)local_58._8_8_,(float)(int)(double)local_58._0_8_);
    uStack_40 = 0;
    fVar7 = _area / (float)(int)(double)local_58._0_8_;
    iVar5 = 0;
    do {
      local_5c.z = (float)iVar5 * fVar7 + _area * -0.5;
      local_60.y = (float)iVar5 / (float)local_48;
      iVar3 = 0;
      do {
        local_58._0_4_ = (float)iVar3;
        local_78.field_1.y = local_64.y;
        local_78.field_0.x = (float)iVar3 * fVar7 + _area * -0.5;
        local_78.field_2.z = local_5c.z;
        Mesh::addVertex(__return_storage_ptr__,(vec3 *)&local_78);
        local_78.field_0 =
             (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x3e808312;
        local_78.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3e808312;
        local_78.field_2 =
             (anon_union_4_3_4e909dac_for_vec<4,_float,_(glm::qualifier)0>_7)0x3e808312;
        local_78.field_3 =
             (anon_union_4_3_4e909a07_for_vec<4,_float,_(glm::qualifier)0>_9)0x3f800000;
        Mesh::addColor(__return_storage_ptr__,&local_78);
        local_78.field_0 = (anon_union_4_3_4e90da17_for_vec<4,_float,_(glm::qualifier)0>_3)0x0;
        local_78.field_1 =
             (anon_union_4_3_4e90b0ec_for_vec<4,_float,_(glm::qualifier)0>_5)0x3f800000;
        local_78._8_8_ = local_78._8_8_ & 0xffffffff00000000;
        Mesh::addNormal(__return_storage_ptr__,(vec3 *)&local_78);
        local_78.field_1 = local_60;
        local_78.field_0.x = (float)local_58._0_4_ / (float)local_48;
        Mesh::addTexCoord(__return_storage_ptr__,(vec2 *)&local_78);
        iVar3 = iVar3 + 1;
      } while (iVar4 + 1 != iVar3);
      bVar6 = iVar5 != iVar4;
      iVar5 = iVar5 + 1;
    } while (bVar6);
    if (iVar4 != 0) {
      uVar2 = 1;
      iVar5 = 0;
      local_68 = iVar4 + 1;
      do {
        local_58._0_4_ = iVar5 + 1;
        _i_00 = uVar2;
        iVar5 = iVar4;
        while (bVar6 = iVar5 != 0, iVar5 = iVar5 + -1, bVar6) {
          _i = _i_00 - 1;
          Mesh::addIndex(__return_storage_ptr__,_i);
          Mesh::addIndex(__return_storage_ptr__,_i_00);
          _i_01 = iVar4 + _i_00 + 1;
          Mesh::addIndex(__return_storage_ptr__,_i_01);
          Mesh::addIndex(__return_storage_ptr__,_i_01);
          Mesh::addIndex(__return_storage_ptr__,iVar4 + _i_00);
          _i_00 = _i_00 + 1;
          Mesh::addIndex(__return_storage_ptr__,_i);
        }
        uVar2 = uVar2 + local_68;
        iVar5 = local_58._0_4_;
      } while (local_58._0_4_ != iVar4);
    }
  }
  Mesh::computeTangents(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

Mesh floorMesh(float _area, int _subD, float _y) {

    int N = pow(2,_subD);

    Mesh mesh;
    float w = _area/float(N);
    float h = _area/2.0;
    for (int z = 0; z <= N; z++){
        for (int x = 0; x <= N; x++){
            mesh.addVertex(glm::vec3(x * w - h, _y, z * w - h));
            mesh.addColor(glm::vec4(0.251, 0.251, 0.251, 1.0));
            mesh.addNormal(glm::vec3(0.0, 1.0, 0.0));
            mesh.addTexCoord(glm::vec2(float(x)/float(N), float(z)/float(N)));
        }
    }
    
    //
    // 0 -- 1 -- 2      A -- B
    // |    |    |      |    | 
    // 3 -- 4 -- 5      C -- D
    // |    |    |
    // 6 -- 7 -- 8
    //
    for (int y = 0; y < N; y++){
        for (int x=0; x < N; x++){
            mesh.addIndex(  x   +   y   * (N+1));   // A
            mesh.addIndex((x+1) +   y   * (N+1));   // B
            mesh.addIndex((x+1) + (y+1) * (N+1));   // D

            mesh.addIndex((x+1) + (y+1) * (N+1));   // D
            mesh.addIndex(  x   + (y+1) * (N+1));   // C
            mesh.addIndex(  x   +   y   * (N+1));   // A
        }
    }
    mesh.computeTangents();

    return mesh;
}